

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult fpexc32_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  _Bool isread_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  if ((((env->cp15).cptr_el[2] & 0x400) != 0) && (iVar1 = arm_current_el(env), iVar1 == 2)) {
    return CP_ACCESS_TRAP_FP_EL2;
  }
  if (((env->cp15).cptr_el[3] & 0x400) == 0) {
    env_local._4_4_ = CP_ACCESS_OK;
  }
  else {
    env_local._4_4_ = CP_ACCESS_TRAP_FP_EL3;
  }
  return env_local._4_4_;
}

Assistant:

static CPAccessResult fpexc32_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                     bool isread)
{
    if ((env->cp15.cptr_el[2] & CPTR_TFP) && arm_current_el(env) == 2) {
        return CP_ACCESS_TRAP_FP_EL2;
    }
    if (env->cp15.cptr_el[3] & CPTR_TFP) {
        return CP_ACCESS_TRAP_FP_EL3;
    }
    return CP_ACCESS_OK;
}